

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cc
# Opt level: O3

unique_ptr<Source,_std::default_delete<Source>_> __thiscall
Source::build(Source *this,string *type,Config *config)

{
  SamplePublisher *pSVar1;
  SamplePublisher *pSVar2;
  int iVar3;
  runtime_error *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar3 = std::__cxx11::string::compare((char *)type);
  if (iVar3 == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,
               "You configured goesrecv to use the \"airspy\" source, but goesrecv was not compiled with Airspy support. Make sure to install the Airspy library before compiling goestools, and look for a message saying \'Found libairspy\' when running cmake."
              );
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)type);
    if (iVar3 == 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,
                 "You configured goesrecv to use the \"hackrf\" source, but goesrecv was not compiled with HackRF support. Make sure to install the HackRF library before compiling goestools, and look for a message saying \'Found libhackrf\' when running cmake."
                );
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)type);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)type);
        if (iVar3 == 0) {
          Nanomsg::open((char *)&local_40,(int)config);
          Nanomsg::setSampleRate((Nanomsg *)local_40._M_dataplus._M_p,(config->nanomsg).sampleRate);
          pSVar1 = (config->nanomsg).samplePublisher._M_t.
                   super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
                   super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
          (config->nanomsg).samplePublisher._M_t.
          super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
          super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
          super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = (SamplePublisher *)0x0;
          pSVar2 = (((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)
                    (local_40._M_dataplus._M_p + 0x30))->_M_t).
                   super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
                   super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
          (((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)
           (local_40._M_dataplus._M_p + 0x30))->_M_t).
          super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
          super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
          super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = pSVar1;
          if (pSVar2 != (SamplePublisher *)0x0) {
            (**(code **)((long)(pSVar2->super_Publisher)._vptr_Publisher + 8))();
          }
          this->_vptr_Source = (_func_int **)local_40._M_dataplus._M_p;
          return (__uniq_ptr_data<Source,_std::default_delete<Source>,_true,_true>)
                 (__uniq_ptr_data<Source,_std::default_delete<Source>,_true,_true>)this;
        }
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_40,"Invalid source: ",type);
        std::runtime_error::runtime_error(prVar4,(string *)&local_40);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,
                 "You configured goesrecv to use the \"rtlsdr\" source, but goesrecv was not compiled with RTL-SDR support. Make sure to install the RTL-SDR library before compiling goestools, and look for a message saying \'Found librtlsdr\' when running cmake."
                );
    }
  }
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Source> Source::build(const std::string& type, Config& config) {
  if (type == "airspy") {
#ifdef BUILD_AIRSPY
    auto airspy = Airspy::open();

    // Use sample rate if set, otherwise default to lowest possible rate.
    // This is 2.5MSPS for the R2 and 3M for the Mini.
    auto rates = airspy->getSampleRates();
    if (config.airspy.sampleRate != 0) {
      auto rate = config.airspy.sampleRate;
      auto pos = std::find(rates.begin(), rates.end(), rate);
      if (pos == rates.end()) {
        std::stringstream ss;
        ss << "You configured the Airspy source to use an unsupported "
           << "sample rate equal to " << rate << ". "
           << "Supported sample rates are: " << std::endl;
        for (size_t i = 0; i < rates.size(); i++) {
          ss << " - " << rates[i] << std::endl;
        }
        throw std::runtime_error(ss.str());
      }
      airspy->setSampleRate(rate);
    } else {
      std::sort(rates.begin(), rates.end());
      airspy->setSampleRate(rates[0]);
    }
    airspy->setFrequency(config.airspy.frequency);
    airspy->setGain(config.airspy.gain);
    airspy->setBiasTee(config.airspy.bias_tee);
    airspy->setSamplePublisher(std::move(config.airspy.samplePublisher));
    return std::unique_ptr<Source>(airspy.release());
#else
    throw std::runtime_error(
        "You configured goesrecv to use the \"airspy\" source, "
        "but goesrecv was not compiled with Airspy support. "
        "Make sure to install the Airspy library before compiling goestools, "
        "and look for a message saying 'Found libairspy' when running cmake.");
#endif
  }

  if (type == "hackrf") {
#ifdef BUILD_HACKRF
    auto hackrf = HackRF::open();

    // Use sample rate if set, otherwise default to lowest possible rate.
    auto rates = hackrf->getSampleRates();
    if (config.hackrf.sampleRate != 0) {
      auto rate = config.hackrf.sampleRate;
      auto pos = std::find(rates.begin(), rates.end(), rate);
      if (pos == rates.end()) {
        std::stringstream ss;
        ss << "You configured the HackRF source to use an unsupported "
           << "sample rate equal to " << rate << ". "
           << "Supported sample rates are: " << std::endl;
        for (size_t i = 0; i < rates.size(); i++) {
          ss << " - " << rates[i] << std::endl;
        }
        throw std::runtime_error(ss.str());
      }
      hackrf->setSampleRate(rate);
    } else {
      std::sort(rates.begin(), rates.end());
      hackrf->setSampleRate(rates[0]);
    }

    hackrf->setFrequency(config.hackrf.frequency);
    hackrf->setRfAmplifier(config.hackrf.rf_amp_enabled);
    hackrf->setIfGain(config.hackrf.if_gain);
    hackrf->setBbGain(config.hackrf.bb_gain);
    hackrf->setBiasTee(config.hackrf.bias_tee);
    hackrf->setSamplePublisher(std::move(config.airspy.samplePublisher));
    return std::unique_ptr<Source>(hackrf.release());
#else
    throw std::runtime_error(
        "You configured goesrecv to use the \"hackrf\" source, "
        "but goesrecv was not compiled with HackRF support. "
        "Make sure to install the HackRF library before compiling goestools, "
        "and look for a message saying 'Found libhackrf' when running cmake.");
#endif
  }

  if (type == "rtlsdr") {
#ifdef BUILD_RTLSDR
    auto rtlsdr = RTLSDR::open(config.rtlsdr.deviceIndex);

    // Use sample rate if set, otherwise default to 2.4MSPS.
    if (config.rtlsdr.sampleRate != 0) {
      rtlsdr->setSampleRate(config.rtlsdr.sampleRate);
    } else {
      rtlsdr->setSampleRate(2400000);
    }
    rtlsdr->setFrequency(config.rtlsdr.frequency);
    rtlsdr->setTunerGain(config.rtlsdr.gain);
    rtlsdr->setBiasTee(config.rtlsdr.bias_tee);
    rtlsdr->setSamplePublisher(std::move(config.rtlsdr.samplePublisher));
    return std::unique_ptr<Source>(rtlsdr.release());
#else
    throw std::runtime_error(
        "You configured goesrecv to use the \"rtlsdr\" source, "
        "but goesrecv was not compiled with RTL-SDR support. "
        "Make sure to install the RTL-SDR library before compiling goestools, "
        "and look for a message saying 'Found librtlsdr' when running cmake.");
#endif
  }
  if (type == "nanomsg") {
    auto nanomsg = Nanomsg::open(config);
    nanomsg->setSampleRate(config.nanomsg.sampleRate);
    nanomsg->setSamplePublisher(std::move(config.nanomsg.samplePublisher));
    return std::unique_ptr<Source>(nanomsg.release());
  }

  throw std::runtime_error("Invalid source: " + type);
}